

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_free_handle(dill_exec_handle handle)

{
  int iVar1;
  int *in_RDI;
  
  *in_RDI = *in_RDI + -1;
  if (*in_RDI < 1) {
    if (((in_RDI[4] != 0) && (*(long *)(in_RDI + 2) != 0)) &&
       (iVar1 = munmap(*(void **)(in_RDI + 2),(long)in_RDI[4]), iVar1 == -1)) {
      perror("unmap 1");
    }
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    in_RDI[4] = 0;
    free(in_RDI);
  }
  return;
}

Assistant:

extern void
dill_free_handle(dill_exec_handle handle)
{
    handle->ref_count--;
    if (handle->ref_count > 0)
        return;
    if (handle->size != 0) {
        if (handle->code_base) {
#ifdef USE_MMAP_CODE_SEG
            if (munmap(handle->code_base, handle->size) == -1)
                perror("unmap 1");
#else
            free(handle->code_base);
#endif
        }
    }
    handle->code_base = NULL;
    handle->size = 0;
#ifdef BUILD_EMULATOR
    free_emulator_handler_bits(handle);
#endif
    free(handle);
}